

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emfile.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  int socks [1000];
  int i;
  int rc;
  
  socks[999] = 0;
  do {
    if (socks[999] == 1000) {
LAB_0010131e:
      do {
        socks[999] = socks[999] + -1;
        if (socks[999] == -1) {
          return 0;
        }
        iVar2 = nn_close(socks[(long)socks[999] + -2]);
        pFVar1 = _stderr;
      } while (iVar2 == 0);
      piVar3 = __errno_location();
      pcVar4 = nn_err_strerror(*piVar3);
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/emfile.c"
              ,0x31);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_socket(1,0x10);
    socks[(long)socks[999] + -2] = iVar2;
    if (socks[(long)socks[999] + -2] < 0) {
      iVar2 = nn_errno();
      pFVar1 = _stderr;
      if (iVar2 != 0x18) {
        piVar3 = __errno_location();
        pcVar4 = nn_err_strerror(*piVar3);
        puVar5 = (uint *)__errno_location();
        fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/emfile.c"
                ,0x28);
        fflush(_stderr);
        nn_err_abort();
      }
      goto LAB_0010131e;
    }
    socks[999] = socks[999] + 1;
  } while( true );
}

Assistant:

int main ()
{
    int rc;
    int i;
    int socks [MAX_SOCKETS];

    /*  First, just create as much SP sockets as possible. */
    for (i = 0; i != MAX_SOCKETS; ++i) {
        socks [i] = nn_socket (AF_SP, NN_PAIR);
        if (socks [i] < 0) {
            errno_assert (nn_errno () == EMFILE);
            break;
        }
    }
    while (1) {
        --i;
        if (i == -1)
            break;
        rc = nn_close (socks [i]);
        errno_assert (rc == 0);
    }

    return 0;
}